

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<3l>::search<anurbs::RTree<3l>::PickByBox>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,void *this,PickByBox *check,
          Callback *callback)

{
  long lVar1;
  bool bVar2;
  Index IVar3;
  runtime_error *this_00;
  reference pvVar4;
  long *plVar5;
  double *pdVar6;
  reference pvVar7;
  long local_f0;
  Matrix<double,_1,_3,_1,_1,_3> local_e8;
  Matrix<double,_1,_3,_1,_1,_3> local_d0;
  undefined1 local_b8 [8];
  Vector node_max;
  Vector node_min;
  Index index;
  Index pos;
  long local_70;
  Index end;
  undefined1 local_60 [8];
  vector<long,_std::allocator<long>_> queue;
  Index level;
  Index node_index;
  Callback *callback_local;
  PickByBox *check_local;
  RTree<3L> *this_local;
  vector<long,_std::allocator<long>_> *results;
  
  lVar1 = *(long *)((long)this + 0x58);
  IVar3 = length<std::vector<long,std::allocator<long>>>
                    ((vector<long,_std::allocator<long>_> *)((long)this + 0x60));
  if (lVar1 != IVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Data not yet indexed - call RTree::finish().");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  IVar3 = length<std::vector<long,std::allocator<long>>>
                    ((vector<long,_std::allocator<long>_> *)((long)this + 0x60));
  level = IVar3 + -1;
  IVar3 = length<std::vector<long,std::allocator<long>>>
                    ((vector<long,_std::allocator<long>_> *)((long)this + 0x10));
  queue.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(IVar3 + -1);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_60);
  end._7_1_ = 0;
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  while (-1 < level) {
    pos = level + *(long *)((long)this + 8);
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)((long)this + 0x10),
                        (size_type)
                        queue.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    plVar5 = std::min<long>(&pos,pvVar4);
    local_70 = *plVar5;
    for (index = level; index < local_70; index = index + 1) {
      pdVar6 = (double *)
               std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)((long)this + 0x60),index);
      node_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *pdVar6;
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             *)((long)this + 0x78),index);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                ((Matrix<double,_1,_3,_1,_1,_3> *)
                 (node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array + 2),pvVar7);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                             *)((long)this + 0x90),index);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)local_b8,pvVar7)
      ;
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                (&local_d0,
                 (Matrix<double,_1,_3,_1,_1,_3> *)
                 (node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array + 2));
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                (&local_e8,(Matrix<double,_1,_3,_1,_1,_3> *)local_b8);
      bVar2 = RTree<3L>::PickByBox::operator()(check,&local_d0,&local_e8);
      if (bVar2) {
        if (level < *this) {
          bVar2 = std::operator==(callback,(nullptr_t)0x0);
          if ((bVar2) ||
             (bVar2 = std::function<bool_(long)>::operator()
                                (callback,(long)node_min.
                                                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                                .m_storage.m_data.array[2]), bVar2)) {
            std::vector<long,_std::allocator<long>_>::push_back
                      (__return_storage_ptr__,
                       (value_type_conflict3 *)
                       (node_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                        m_storage.m_data.array + 2));
          }
        }
        else {
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)local_60,
                     (value_type_conflict3 *)
                     (node_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                      m_storage.m_data.array + 2));
          local_f0 = (long)queue.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + -1;
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)local_60,&local_f0);
        }
      }
    }
    bVar2 = std::vector<long,_std::allocator<long>_>::empty
                      ((vector<long,_std::allocator<long>_> *)local_60);
    if (bVar2) {
      level = -1;
      queue.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0xffffffffffffffff;
    }
    else {
      pvVar4 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)local_60);
      queue.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*pvVar4;
      std::vector<long,_std::allocator<long>_>::pop_back
                ((vector<long,_std::allocator<long>_> *)local_60);
      pvVar4 = std::vector<long,_std::allocator<long>_>::back
                         ((vector<long,_std::allocator<long>_> *)local_60);
      level = *pvVar4;
      std::vector<long,_std::allocator<long>_>::pop_back
                ((vector<long,_std::allocator<long>_> *)local_60);
    }
  }
  end._7_1_ = 1;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_60)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> search(const TCheck& check, Callback callback)
    {
        if (m_position != length(m_indices)) {
            throw std::runtime_error("Data not yet indexed - call RTree::finish().");
        }

        Index node_index = length(m_indices) - 1;
        Index level = length(m_level_bounds) - 1;
        std::vector<Index> queue;
        std::vector<Index> results;

        while (node_index > -1) {
            const Index end = std::min<Index>(node_index + m_node_size, m_level_bounds[level]);

            for (Index pos = node_index; pos < end; pos++) {
                const Index index = m_indices[pos];

                const Vector node_min = m_boxes_min[pos];
                const Vector node_max = m_boxes_max[pos];

                if (!check(node_min, node_max)) {
                    continue;
                }

                if (node_index < m_nb_items) {
                    if (callback == nullptr || callback(index)) {
                        results.push_back(index);
                    }
                } else {
                    queue.push_back(index);
                    queue.push_back(level - 1);
                }
            }

            if (queue.empty()) {
                node_index = -1;
                level = -1;
            } else {
                level = queue.back();
                queue.pop_back();
                node_index = queue.back();
                queue.pop_back();
            }
        }

        return results;
    }